

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O2

void forward_DCT_float(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY sample_data,
                      JBLOCKROW coef_blocks,JDIMENSION start_row,JDIMENSION start_col,
                      JDIMENSION num_blocks)

{
  forward_DCT_ptr p_Var1;
  forward_DCT_ptr p_Var2;
  int i;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  JBLOCKROW paJVar6;
  JDIMENSION JVar7;
  ulong uVar8;
  float workspace [64];
  JDIMENSION in_stack_fffffffffffffeb8;
  
  p_Var1 = cinfo->fdct[2].forward_DCT[(long)compptr->component_index + 2];
  paJVar6 = (JBLOCKROW)(long)compptr->quant_tbl_no;
  p_Var2 = cinfo->fdct[3].forward_DCT[(long)((long)*paJVar6 + 1)];
  uVar3 = (ulong)start_row;
  JVar7 = start_col;
  for (uVar8 = 0; uVar8 != num_blocks; uVar8 = uVar8 + 1) {
    (*p_Var1)((j_compress_ptr)&stack0xfffffffffffffec8,(jpeg_component_info *)(sample_data + uVar3),
              (JSAMPARRAY)(ulong)JVar7,paJVar6,start_row,start_col,in_stack_fffffffffffffeb8);
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      uVar5 = (int)(*(float *)(&stack0xfffffffffffffec8 + lVar4 * 4) *
                    *(float *)(p_Var2 + lVar4 * 4) + 16384.5) - 0x4000;
      paJVar6 = (JBLOCKROW)(ulong)uVar5;
      (*coef_blocks)[lVar4] = (JCOEF)uVar5;
    }
    JVar7 = JVar7 + compptr->DCT_h_scaled_size;
    coef_blocks = coef_blocks + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
forward_DCT_float (j_compress_ptr cinfo, jpeg_component_info * compptr,
		   JSAMPARRAY sample_data, JBLOCKROW coef_blocks,
		   JDIMENSION start_row, JDIMENSION start_col,
		   JDIMENSION num_blocks)
/* This version is used for floating-point DCT implementations. */
{
  /* This routine is heavily used, so it's worth coding it tightly. */
  my_fdct_ptr fdct = (my_fdct_ptr) cinfo->fdct;
  float_DCT_method_ptr do_dct = fdct->do_float_dct[compptr->component_index];
  FAST_FLOAT * divisors = fdct->float_divisors[compptr->quant_tbl_no];
  FAST_FLOAT workspace[DCTSIZE2]; /* work area for FDCT subroutine */
  JDIMENSION bi;

  sample_data += start_row;	/* fold in the vertical offset once */

  for (bi = 0; bi < num_blocks; bi++, start_col += compptr->DCT_h_scaled_size) {
    /* Perform the DCT */
    (*do_dct) (workspace, sample_data, start_col);

    /* Quantize/descale the coefficients, and store into coef_blocks[] */
    { register FAST_FLOAT temp;
      register int i;
      register JCOEFPTR output_ptr = coef_blocks[bi];

      for (i = 0; i < DCTSIZE2; i++) {
	/* Apply the quantization and scaling factor */
	temp = workspace[i] * divisors[i];
	/* Round to nearest integer.
	 * Since C does not specify the direction of rounding for negative
	 * quotients, we have to force the dividend positive for portability.
	 * The maximum coefficient size is +-16K (for 12-bit data), so this
	 * code should work for either 16-bit or 32-bit ints.
	 */
	output_ptr[i] = (JCOEF) ((int) (temp + (FAST_FLOAT) 16384.5) - 16384);
      }
    }
  }
}